

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::switch_statement::print(switch_statement *this,wostream *os)

{
  expression *peVar1;
  pointer pcVar2;
  _Head_base<0UL,_mjs::expression_*,_false> _Var3;
  __uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_> _Var4;
  bool bVar5;
  wostream *pwVar6;
  pointer puVar7;
  case_clause *c;
  pointer pcVar8;
  size_t i;
  ulong uVar9;
  
  pwVar6 = std::operator<<(os,"switch_statement{");
  peVar1 = (this->e_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,pwVar6);
  std::operator<<(pwVar6,", [");
  pcVar2 = (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = true;
  for (pcVar8 = (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>.
                _M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar2; pcVar8 = pcVar8 + 1) {
    if (!bVar5) {
      std::operator<<(os,", ");
    }
    std::operator<<(os,"{");
    _Var3._M_head_impl =
         (pcVar8->e_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    if (_Var3._M_head_impl != (expression *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_syntax_node + 0x10))(_Var3._M_head_impl,os)
      ;
      std::operator<<(os,", ");
    }
    std::operator<<(os,"[");
    for (uVar9 = 0;
        puVar7 = (pcVar8->sl_).
                 super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(pcVar8->sl_).
                              super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3);
        uVar9 = uVar9 + 1) {
      if (uVar9 != 0) {
        std::operator<<(os,", ");
        puVar7 = (pcVar8->sl_).
                 super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      _Var4._M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
      super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
           puVar7[uVar9]._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t;
      (**(code **)(*(long *)_Var4._M_t.
                            super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                            .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 0x10))
                (_Var4._M_t.
                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                 super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,os);
    }
    std::operator<<(os,"]}");
    bVar5 = false;
  }
  std::operator<<(os,"]}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "switch_statement{" << e() << ", [";
        bool first = true;
        for (const auto& c: cl()) {
            if (!first) os << ", ";
            first = false;
            os << "{";
            if (c.e()) {
                os << *c.e() << ", ";
            }
            os << "[";
            for (size_t i = 0; i < c.sl().size(); ++i) {
                if (i) os << ", ";
                os << *c.sl()[i];
            }
            os << "]}";
        }
        os << "]}";
    }